

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SPPMIntegrator::SampleLd
          (SPPMIntegrator *this,SurfaceInteraction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler,LightSamplerHandle *lightSampler)

{
  Normal3f *pNVar1;
  Vector3f *pVVar2;
  anon_struct_60_5_be74bf41_for_shading *paVar3;
  long lVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar15;
  undefined4 uVar16;
  Interval<float> IVar12;
  pointer pLVar13;
  undefined4 uVar17;
  size_t sVar14;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  LightSampleContext LVar25;
  LightSampleContext LVar26;
  LightSampleContext LVar27;
  LightSampleContext LVar28;
  Vector3f wiRender;
  Vector3f wiRender_00;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [24];
  undefined1 auVar32 [32];
  undefined1 auVar33 [24];
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  Interval<float> *pIVar38;
  Point3fi *pPVar39;
  Point3fi *pPVar40;
  undefined8 uVar41;
  undefined1 wiRender_01 [12];
  bool bVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  ulong uVar46;
  BSDF *pBVar47;
  undefined1 this_00 [8];
  PowerLightSampler *this_01;
  ExhaustiveLightSampler *pEVar48;
  DebugMLTSampler *pDVar49;
  pointer pLVar50;
  long in_FS_OFFSET;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar57 [48];
  undefined1 auVar54 [64];
  undefined1 auVar56 [64];
  Float f_2;
  Float FVar58;
  undefined1 auVar61 [16];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  float fVar60;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar72 [64];
  float fVar59;
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar81 [64];
  undefined1 auVar62 [16];
  undefined1 auVar82 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar83 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar63 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar87 [64];
  undefined1 auVar64 [16];
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar88 [64];
  undefined4 uVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar99 [56];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  Float f_1;
  undefined1 auVar100 [16];
  undefined1 in_ZMM5 [64];
  SampledSpectrum SVar101;
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f VVar102;
  Vector3f VVar103;
  Vector3f VVar104;
  Vector3f VVar105;
  Vector3f wiRender_02;
  SampledSpectrum f;
  Vector3f wi;
  SampledSpectrum Le;
  optional<pbrt::SampledLight> sampledLight;
  BSDFSample bs;
  LightLiSample ls;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  DispatchSplit<5> local_379;
  undefined1 local_378 [8];
  undefined8 uStack_370;
  undefined1 local_368 [12];
  float fStack_35c;
  Interval<float> IStack_358;
  undefined8 uStack_350;
  float fStack_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  float local_33c;
  undefined1 local_338 [16];
  SampledWavelengths *local_328;
  BSDF *local_320;
  Vector3f local_318;
  undefined8 local_308;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [4];
  undefined1 auStack_2f4 [4];
  float afStack_2f0 [2];
  undefined1 local_2e8 [16];
  undefined8 local_2d8;
  float local_2c8;
  undefined4 local_2c4;
  Vector3f *local_2c0;
  ulong *puStack_2b8;
  ulong *local_2b0;
  BSDFSample local_2a8;
  undefined1 local_278 [24];
  Tuple3<pbrt::Normal3,_float> TStack_260;
  Tuple3<pbrt::Normal3,_float> local_254;
  Interval<float> local_248;
  Interval<float> IStack_240;
  Interval<float> IStack_238;
  undefined8 uStack_230;
  float local_228;
  undefined4 local_224;
  undefined4 uStack_220;
  float local_21c;
  LightSamplerHandle *local_218;
  ulong local_210;
  ulong local_208;
  float local_200;
  Interval<float> local_1f8;
  Interval<float> IStack_1f0;
  Interval<float> IStack_1e8;
  undefined8 uStack_1e0;
  float fStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  float fStack_1cc;
  Interval<float> local_1c8;
  float fStack_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  Float FStack_1b0;
  undefined4 uStack_1ac;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_1a8;
  Interval<float> local_198;
  Interval<float> IStack_190;
  Interval<float> IStack_188;
  undefined8 uStack_180;
  float local_178;
  undefined8 local_174;
  float local_16c;
  Interval<float> local_168;
  Interval<float> IStack_160;
  undefined1 local_158 [8];
  float afStack_150 [2];
  Interval<float> IStack_148;
  undefined8 uStack_140;
  float fStack_138;
  undefined1 auStack_134 [8];
  float fStack_12c;
  undefined1 auStack_128 [16];
  undefined1 local_118 [64];
  undefined1 local_d8 [64];
  undefined1 local_98 [64];
  ulong local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 auVar53 [64];
  undefined1 auVar55 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 auVar89 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 auVar94 [64];
  
  auVar72 = _local_158;
  auVar57 = in_ZmmResult._16_48_;
  auVar52 = in_ZMM1._0_16_;
  uStack_370 = local_378;
  local_378 = (undefined1  [8])this;
  IStack_148 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  auVar68 = _local_158;
  pPVar39 = &(intr->super_Interaction).pi;
  pPVar40 = &(intr->super_Interaction).pi;
  uVar34 = (pPVar39->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  uVar35 = (pPVar39->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  local_158._4_4_ = uVar35;
  local_158._0_4_ = uVar34;
  uVar36 = (pPVar40->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  uVar37 = (pPVar40->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  afStack_150[1] = (float)uVar37;
  afStack_150[0] = (float)uVar36;
  _IStack_148 = auVar68._16_48_;
  auVar68 = _local_158;
  uVar8 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar15 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  uStack_140._4_4_ = uVar15;
  uStack_140._0_4_ = uVar8;
  _local_158 = auVar68._0_24_;
  fStack_138 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  uVar9 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar16 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  auStack_134._4_4_ = uVar16;
  auStack_134._0_4_ = uVar9;
  auStack_128 = auVar72._48_16_;
  fStack_12c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_368._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_328 = lambda;
  local_308 = (Interval<float> *)sampler;
  FVar58 = detail::DispatchSplit<8>::operator()
                     ((DispatchSplit<8> *)local_278,local_368,(ulong)local_368._0_8_ >> 0x30);
  uVar46 = (lightSampler->
           super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
           ).bits;
  local_218 = lightSampler;
  if ((ushort)(uVar46 >> 0x30) < 3) {
    this_01 = (PowerLightSampler *)(uVar46 & 0xffffffffffff);
    if ((uVar46 & 0x3000000000000) == 0x2000000000000) {
      PowerLightSampler::Sample((optional<pbrt::SampledLight> *)local_2e8,this_01,FVar58);
      goto LAB_0044632a;
    }
    sVar14 = (this_01->lights).nStored;
    if (sVar14 == 0) {
      local_2e8._0_12_ = ZEXT412(0);
      local_2e8._12_4_ = 0;
      local_2d8._0_1_ = false;
      local_2d8._1_7_ = 0;
      bVar42 = false;
    }
    else {
      auVar52 = vcvtusi2ss_avx512f(auVar52,sVar14);
      iVar44 = (int)sVar14 + -1;
      iVar45 = (int)(FVar58 * auVar52._0_4_);
      if (iVar45 <= iVar44) {
        iVar44 = iVar45;
      }
      bVar42 = true;
      local_2e8._8_4_ = 1.0 / auVar52._0_4_;
      local_2e8._0_8_ =
           (this_01->lights).ptr[iVar44].
           super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           .bits;
    }
    local_2d8._0_1_ = bVar42;
    this_00 = local_378;
  }
  else {
    if ((uVar46 & 0xfffe000000000000) == 0x2000000000000) {
      BVHLightSampler::Sample
                ((optional<pbrt::SampledLight> *)local_2e8,
                 (BVHLightSampler *)(uVar46 & 0xffffffffffff),(LightSampleContext *)local_158,FVar58
                );
    }
    else {
      ExhaustiveLightSampler::Sample
                ((optional<pbrt::SampledLight> *)local_2e8,
                 (ExhaustiveLightSampler *)(uVar46 & 0xffffffffffff),(LightSampleContext *)local_158
                 ,FVar58);
    }
LAB_0044632a:
    this_00 = local_378;
  }
  IVar12 = *local_308;
  uVar43 = (uint)IVar12.high._2_2_;
  if ((ulong)IVar12 >> 0x30 < 5) {
    if ((ulong)IVar12 < 0x3000000000000) {
      if (uVar43 == 2) {
        auVar65._0_8_ =
             PaddedSobolSampler::Get2D((PaddedSobolSampler *)((ulong)IVar12 & 0xffffffffffff));
        auVar65._8_56_ = extraout_var_03;
        auVar52 = auVar65._0_16_;
      }
      else {
        auVar69._0_8_ = HaltonSampler::Get2D((HaltonSampler *)((ulong)IVar12 & 0xffffffffffff));
        auVar69._8_56_ = extraout_var_07;
        auVar52 = auVar69._0_16_;
      }
    }
    else if ((uVar43 & 6) == 2) {
      auVar67._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)((ulong)IVar12 & 0xffffffffffff));
      auVar67._8_56_ = extraout_var_05;
      auVar52 = auVar67._0_16_;
    }
    else {
      auVar71._0_8_ = RandomSampler::Get2D((RandomSampler *)((ulong)IVar12 & 0xffffffffffff));
      auVar71._8_56_ = extraout_var_09;
      auVar52 = auVar71._0_16_;
    }
  }
  else {
    uVar43 = uVar43 - 4;
    if (uVar43 < 3) {
      if (uVar43 == 2) {
        auVar66._0_8_ =
             StratifiedSampler::Get2D((StratifiedSampler *)((ulong)IVar12 & 0xffffffffffff));
        auVar66._8_56_ = extraout_var_04;
        auVar52 = auVar66._0_16_;
      }
      else {
        auVar70._0_8_ = SobolSampler::Get2D((SobolSampler *)((ulong)IVar12 & 0xffffffffffff));
        auVar70._8_56_ = extraout_var_08;
        auVar52 = auVar70._0_16_;
      }
    }
    else {
      pDVar49 = (DebugMLTSampler *)((ulong)IVar12 & 0xffffffffffff);
      if ((uVar43 & 0x7ffffffe) == 2) {
        auVar68._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar49);
        auVar68._8_56_ = extraout_var_06;
        auVar52 = auVar68._0_16_;
      }
      else {
        local_398._0_4_ = DebugMLTSampler::Get1D(pDVar49);
        local_398._4_4_ = extraout_XMM0_Db;
        fStack_390 = (float)extraout_XMM0_Dc;
        fStack_38c = (float)extraout_XMM0_Dd;
        auVar72._0_4_ = DebugMLTSampler::Get1D(pDVar49);
        auVar72._4_60_ = extraout_var;
        auVar52 = vinsertps_avx(_local_398,auVar72._0_16_,0x10);
      }
    }
  }
  auVar51 = local_2e8;
  pNVar1 = &(intr->super_Interaction).n;
  paVar3 = &intr->shading;
  _local_398 = ZEXT816(0);
  local_320 = bsdf;
  pIVar38 = local_308;
  if (local_2d8._0_1_ == true) {
    IStack_358 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    uVar41 = local_2e8._0_8_;
    TStack_260._0_8_ = local_2f8;
    local_278._0_8_ = local_368;
    local_368._0_8_ =
         (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
    unique0x10001a9b =
         (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
    uStack_350._0_4_ = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).x;
    uStack_350._4_4_ = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).y;
    fStack_348 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_174._0_4_ = (paVar3->n).super_Tuple3<pbrt::Normal3,_float>.x;
    local_174._4_4_ = (paVar3->n).super_Tuple3<pbrt::Normal3,_float>.y;
    local_33c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_1c8.low = (local_328->lambda).values[0];
    local_1c8.high = (local_328->lambda).values[1];
    uVar22 = *(undefined8 *)((local_328->lambda).values + 2);
    uVar23 = *(undefined8 *)(local_328->pdf).values;
    uVar24 = *(undefined8 *)((local_328->pdf).values + 2);
    local_278._16_8_ = &local_1c8;
    auVar100._12_4_ = 0;
    auVar100._0_12_ = _auStack_2f4;
    _local_2f8 = auVar100 << 0x20;
    fStack_1c0 = (float)uVar22;
    fStack_1bc = (float)((ulong)uVar22 >> 0x20);
    fStack_1b8 = (float)uVar23;
    fStack_1b4 = (float)((ulong)uVar23 >> 0x20);
    FStack_1b0 = (Float)uVar24;
    uStack_1ac = (undefined4)((ulong)uVar24 >> 0x20);
    local_278._8_8_ = &local_2c0;
    local_2c0 = (Vector3f *)vmovlps_avx(auVar52);
    uVar46 = (ulong)local_2e8._0_8_ >> 0x30;
    local_2a8.f.values.values[0] = (float)local_2e8._0_4_;
    local_2a8.f.values.values[1] = (float)local_2e8._4_4_;
    in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
    uStack_344 = (undefined4)local_174;
    uStack_340 = local_174._4_4_;
    local_2e8 = auVar51;
    local_198 = (Interval<float>)local_368._0_8_;
    IStack_190 = unique0x10001a9b;
    IStack_188 = IStack_358;
    uStack_180 = uStack_350;
    local_178 = fStack_348;
    local_16c = local_33c;
    detail::DispatchSplit<9>::operator()(local_158,(DispatchSplit<9> *)&local_208,&local_2a8,uVar46)
    ;
    auVar72 = _local_158;
    auVar89 = _afStack_150;
    _local_398 = ZEXT816(0);
    bVar42 = 0.0 < (float)uStack_140._4_4_;
    _afStack_150 = auVar89;
    pIVar38 = local_308;
    if (bVar42) {
      if (((float)local_158._0_4_ == 0.0) && (!NAN((float)local_158._0_4_))) {
        uVar46 = 0xffffffffffffffff;
        do {
          if (uVar46 == 2) goto LAB_0044682d;
          lVar4 = uVar46 * 4;
          uVar46 = uVar46 + 1;
        } while ((*(float *)(local_158 + lVar4 + 8) == 0.0) &&
                (!NAN(*(float *)(local_158 + lVar4 + 8))));
        if (2 < uVar46) goto LAB_0044682d;
      }
      pVVar2 = &(intr->super_Interaction).wo;
      local_48._0_4_ = (pVVar2->super_Tuple3<pbrt::Vector3,_float>).x;
      local_48._4_4_ = (pVVar2->super_Tuple3<pbrt::Vector3,_float>).y;
      local_2c8 = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      IVar12 = IStack_148;
      uVar90 = (undefined4)uStack_140;
      wiRender_01 = _IStack_148;
      uStack_40 = 0;
      local_338._8_8_ = 0;
      IStack_148.low = IVar12.low;
      IStack_148.high = IVar12.high;
      local_338._0_4_ = IStack_148.low;
      local_338._4_4_ = IStack_148.high;
      auVar99 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar89 = ZEXT856(0);
      _local_158 = auVar72;
      SVar101 = BSDF::f(local_320,(Vector3f)pVVar2->super_Tuple3<pbrt::Vector3,_float>,
                        (Vector3f)wiRender_01,Radiance);
      auVar72 = _local_158;
      auVar94._0_8_ = SVar101.values.values._8_8_;
      auVar94._8_56_ = auVar99;
      auVar73._0_8_ = SVar101.values.values._0_8_;
      auVar73._8_56_ = auVar89;
      fVar60 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
      in_ZMM5 = ZEXT464((uint)uVar90);
      auVar52 = vmovlhps_avx(auVar73._0_16_,auVar94._0_16_);
      auVar51 = vmovshdup_avx(local_338);
      auVar100 = ZEXT416((uint)((float)uVar90 * fVar60));
      auVar51 = vfmadd132ss_fma(auVar51,auVar100,
                                ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y
                                       ));
      auVar100 = vfmsub213ss_fma(ZEXT416((uint)fVar60),ZEXT416((uint)uVar90),auVar100);
      auVar51 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ + auVar100._0_4_)),local_338,
                                ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x
                                       ));
      auVar91._0_4_ = auVar51._0_4_;
      auVar91._4_4_ = auVar91._0_4_;
      auVar91._8_4_ = auVar91._0_4_;
      auVar91._12_4_ = auVar91._0_4_;
      auVar51._8_4_ = 0x7fffffff;
      auVar51._0_8_ = 0x7fffffff7fffffff;
      auVar51._12_4_ = 0x7fffffff;
      auVar51 = vandps_avx512vl(auVar91,auVar51);
      local_368._0_4_ = auVar51._0_4_ * auVar52._0_4_;
      local_368._4_4_ = auVar51._4_4_ * auVar52._4_4_;
      fStack_35c = auVar51._12_4_ * auVar52._12_4_;
      local_368._8_4_ = auVar51._8_4_ * auVar52._8_4_;
      if (((float)local_368._0_4_ == 0.0) && (!NAN((float)local_368._0_4_))) {
        uVar46 = 0xffffffffffffffff;
        do {
          _local_398 = ZEXT816(0);
          pIVar38 = local_308;
          if (uVar46 == 2) goto LAB_0044682d;
          lVar4 = uVar46 * 4;
          uVar46 = uVar46 + 1;
        } while ((*(float *)(local_368 + lVar4 + 8) == 0.0) &&
                (!NAN(*(float *)(local_368 + lVar4 + 8))));
        if (2 < uVar46) goto LAB_0044682d;
      }
      local_168.low = (float)local_158._0_4_;
      local_168.high = (float)local_158._4_4_;
      IStack_160.low = afStack_150[0];
      IStack_160.high = afStack_150[1];
      _local_158 = auVar72;
      bVar42 = Integrator::Unoccluded
                         ((Integrator *)this_00,&intr->super_Interaction,
                          (Interaction *)(auStack_134 + 4));
      pBVar47 = local_320;
      auVar52 = local_338;
      auVar89 = _afStack_150;
      _local_398 = ZEXT816(0);
      pIVar38 = local_308;
      if (bVar42) {
        if (local_2d8._0_1_ == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
        }
        fVar60 = (float)local_2e8._8_4_ * (float)uStack_140._4_4_;
        if (*(uint *)(uVar41 & 0xffffffffffff) < 2) {
          auVar52._0_4_ = local_168.low * (float)local_368._0_4_;
          auVar52._4_4_ = local_168.high * (float)local_368._4_4_;
          auVar52._8_4_ = IStack_160.low * (float)local_368._8_4_;
          auVar52._12_4_ = IStack_160.high * fStack_35c;
          _afStack_150 = auVar89;
        }
        else {
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = local_2c8;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_48;
          woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_48._4_4_;
          wiRender_02.super_Tuple3<pbrt::Vector3,_float>.z = (float)uVar90;
          wiRender_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_338._0_4_;
          wiRender_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_338._4_4_;
          local_338 = auVar52;
          FVar58 = BSDF::PDF(local_320,woRender,wiRender_02,Radiance,All);
          local_338._0_4_ = FVar58;
          if (SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
              ::reg == '\0') {
            iVar44 = __cxa_guard_acquire(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                                          ::reg);
            if (iVar44 != 0) {
              StatRegisterer::StatRegisterer
                        ((StatRegisterer *)
                         &SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                          ::reg,SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                                ::StatsAccumulator__,(PixelAccumFunc)0x0);
              __cxa_guard_release(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                                   ::reg);
              pBVar47 = local_320;
              this_00 = local_378;
            }
          }
          *(long *)(in_FS_OFFSET + -600) = *(long *)(in_FS_OFFSET + -600) + 1;
          if ((((float)local_338._0_4_ == 0.0) && (!NAN((float)local_338._0_4_))) &&
             (1 < *(ushort *)
                   ((long)&(pBVar47->bxdf).
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                           .bits + 6) - 3)) {
            *(long *)(in_FS_OFFSET + -0x260) = *(long *)(in_FS_OFFSET + -0x260) + 1;
          }
          auVar52 = vfmadd231ss_fma(ZEXT416((uint)((float)local_338._0_4_ * (float)local_338._0_4_))
                                    ,ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
          fVar59 = (fVar60 * fVar60) / auVar52._0_4_;
          auVar52._0_4_ = fVar59 * local_168.low * (float)local_368._0_4_;
          auVar52._4_4_ = fVar59 * local_168.high * (float)local_368._4_4_;
          auVar52._8_4_ = fVar59 * IStack_160.low * (float)local_368._8_4_;
          auVar52._12_4_ = fVar59 * IStack_160.high * fStack_35c;
        }
        auVar92._4_4_ = fVar60;
        auVar92._0_4_ = fVar60;
        auVar92._8_4_ = fVar60;
        auVar92._12_4_ = fVar60;
        auVar52 = vdivps_avx(auVar52,auVar92);
        auVar51 = vshufpd_avx(auVar52,auVar52,1);
        _local_398 = vunpcklpd_avx(auVar52,auVar51);
        pIVar38 = local_308;
      }
    }
  }
LAB_0044682d:
  pBVar47 = local_320;
  local_158 = *(undefined1 (*) [8])pIVar38;
  local_308 = pIVar38;
  FVar58 = detail::DispatchSplit<8>::operator()
                     ((DispatchSplit<8> *)local_368,local_158,(ulong)local_158 >> 0x30);
  uVar6 = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar7 = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
  local_338._4_4_ = uVar7;
  local_338._0_4_ = uVar6;
  fVar60 = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
  IVar12 = *pIVar38;
  local_378._0_4_ = FVar58;
  local_338._8_8_ = 0;
  uVar43 = (uint)IVar12.high._2_2_;
  if ((ulong)IVar12 < 0x5000000000000) {
    if ((ulong)IVar12 < 0x3000000000000) {
      if (uVar43 == 2) {
        auVar74._0_8_ =
             PaddedSobolSampler::Get2D((PaddedSobolSampler *)((ulong)IVar12 & 0xffffffffffff));
        auVar74._8_56_ = extraout_var_10;
        auVar52 = auVar74._0_16_;
      }
      else {
        auVar78._0_8_ = HaltonSampler::Get2D((HaltonSampler *)((ulong)IVar12 & 0xffffffffffff));
        auVar78._8_56_ = extraout_var_14;
        auVar52 = auVar78._0_16_;
      }
    }
    else if ((uVar43 & 6) == 2) {
      auVar76._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)((ulong)IVar12 & 0xffffffffffff));
      auVar76._8_56_ = extraout_var_12;
      auVar52 = auVar76._0_16_;
    }
    else {
      auVar80._0_8_ = RandomSampler::Get2D((RandomSampler *)((ulong)IVar12 & 0xffffffffffff));
      auVar80._8_56_ = extraout_var_16;
      auVar52 = auVar80._0_16_;
    }
  }
  else {
    uVar43 = uVar43 - 4;
    if (uVar43 < 3) {
      if (uVar43 == 2) {
        auVar75._0_8_ =
             StratifiedSampler::Get2D((StratifiedSampler *)((ulong)IVar12 & 0xffffffffffff));
        auVar75._8_56_ = extraout_var_11;
        auVar52 = auVar75._0_16_;
      }
      else {
        auVar79._0_8_ = SobolSampler::Get2D((SobolSampler *)((ulong)IVar12 & 0xffffffffffff));
        auVar79._8_56_ = extraout_var_15;
        auVar52 = auVar79._0_16_;
      }
    }
    else {
      pDVar49 = (DebugMLTSampler *)((ulong)IVar12 & 0xffffffffffff);
      if ((uVar43 & 0x7ffffffe) == 2) {
        auVar77._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar49);
        auVar77._8_56_ = extraout_var_13;
        auVar52 = auVar77._0_16_;
      }
      else {
        FVar58 = DebugMLTSampler::Get1D(pDVar49);
        local_308._0_4_ = FVar58;
        local_308._4_4_ = (float)extraout_XMM0_Db_00;
        fStack_300 = (float)extraout_XMM0_Dc_00;
        fStack_2fc = (float)extraout_XMM0_Dd_00;
        auVar81._0_4_ = DebugMLTSampler::Get1D(pDVar49);
        auVar81._4_60_ = extraout_var_00;
        auVar29._8_4_ = fStack_300;
        auVar29._0_8_ = local_308;
        auVar29._12_4_ = fStack_2fc;
        auVar52 = vinsertps_avx(auVar29,auVar81._0_16_,0x10);
      }
    }
  }
  auVar51 = local_338;
  local_158 = (undefined1  [8])vmovlps_avx(auVar52);
  woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar60;
  woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_338._0_4_;
  woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_338._4_4_;
  local_338 = auVar51;
  BSDF::Sample_f(&local_2a8,pBVar47,woRender_00,(Float)local_378._0_4_,(Point2f *)local_158,Radiance
                 ,All);
  if (0.0 < local_2a8.pdf) {
    if ((local_2a8.f.values.values[0] == 0.0) && (!NAN(local_2a8.f.values.values[0]))) {
      uVar46 = 0xffffffffffffffff;
      do {
        if (uVar46 == 2) goto LAB_00447440;
        fVar60 = local_2a8.f.values.values[uVar46 + 2];
        uVar46 = uVar46 + 1;
      } while ((fVar60 == 0.0) && (!NAN(fVar60)));
      if (2 < uVar46) goto LAB_00447440;
    }
    local_318.super_Tuple3<pbrt::Vector3,_float>.z =
         local_2a8.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    local_318.super_Tuple3<pbrt::Vector3,_float>.x =
         local_2a8.wi.super_Tuple3<pbrt::Vector3,_float>.x;
    local_318.super_Tuple3<pbrt::Vector3,_float>.y =
         local_2a8.wi.super_Tuple3<pbrt::Vector3,_float>.y;
    fVar60 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar51 = ZEXT416((uint)(fVar60 * local_2a8.wi.super_Tuple3<pbrt::Vector3,_float>.z));
    auVar52 = vfmadd132ss_fma(ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y),
                              auVar51,ZEXT416((uint)local_318.super_Tuple3<pbrt::Vector3,_float>.y))
    ;
    auVar51 = vfmsub213ss_fma(ZEXT416((uint)local_2a8.wi.super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)fVar60),auVar51);
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ + auVar51._0_4_)),
                              ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x),
                              ZEXT416((uint)local_318.super_Tuple3<pbrt::Vector3,_float>.x));
    uVar90 = auVar52._0_4_;
    auVar61._4_4_ = uVar90;
    auVar61._0_4_ = uVar90;
    auVar61._8_4_ = uVar90;
    auVar61._12_4_ = uVar90;
    auVar19._8_4_ = 0x7fffffff;
    auVar19._0_8_ = 0x7fffffff7fffffff;
    auVar19._12_4_ = 0x7fffffff;
    auVar83._0_16_ = vandps_avx512vl(auVar61,auVar19);
    auVar83._16_48_ = auVar57;
    local_308._0_4_ = auVar83._0_4_ * local_2a8.f.values.values[0];
    local_308._4_4_ = auVar83._4_4_ * local_2a8.f.values.values[1];
    fStack_300 = auVar83._8_4_ * local_2a8.f.values.values[2];
    fStack_2fc = auVar83._12_4_ * local_2a8.f.values.values[3];
    Interaction::SpawnRay((RayDifferential *)local_158,&intr->super_Interaction,&local_318);
    auVar72 = _local_158;
    *(long *)(in_FS_OFFSET + -0x2d8) = *(long *)(in_FS_OFFSET + -0x2d8) + 1;
    fStack_1b8 = local_158._16_4_;
    fStack_1b4 = local_158._20_4_;
    FStack_1b0 = local_158._24_4_;
    local_1c8.low = (float)local_158._0_4_;
    local_1c8.high = (float)local_158._4_4_;
    fStack_1c0 = auVar72._8_4_;
    fStack_1bc = auVar72._12_4_;
    local_1a8.bits = _fStack_138;
    if (((((Integrator *)this_00)->aggregate).
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         .bits & 0xffffffffffff) == 0) {
      auVar83 = ZEXT864(0) << 0x20;
      local_58 = 0;
      _local_158 = auVar83;
      local_118 = auVar83;
      local_d8 = auVar83;
      auVar72 = auVar83;
    }
    else {
      _local_158 = auVar72;
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)local_158,&((Integrator *)this_00)->aggregate,
                 (Ray *)&local_1c8,INFINITY);
      auVar57 = auVar83._16_48_;
      auVar52 = in_ZMM5._0_16_;
      auVar72 = local_98;
      if ((local_58 & 1) != 0) {
        auVar62._0_8_ = CONCAT44(fStack_1b8,fStack_1bc) ^ 0x8000000080000000;
        auVar62._8_4_ = 0x80000000;
        auVar62._12_4_ = 0x80000000;
        auVar89 = ZEXT856(auVar62._8_8_);
        auVar93._8_4_ = 0x80000000;
        auVar93._0_8_ = 0x8000000000000000;
        auVar93._12_4_ = 0x80000000;
        auVar99 = ZEXT856(auVar93._8_8_);
        local_368._0_8_ = vmovlps_avx(auVar62);
        stack0xfffffffffffffca0 = (Interval<float>)(CONCAT44(fStack_35c,fStack_1b4) ^ 0x80000000);
        SVar101 = SurfaceInteraction::Le
                            ((SurfaceInteraction *)local_158,(Vector3f *)local_368,local_328);
        auVar95._0_8_ = SVar101.values.values._8_8_;
        auVar95._8_56_ = auVar99;
        auVar82._0_8_ = SVar101.values.values._0_8_;
        auVar82._8_56_ = auVar89;
        _local_2f8 = vmovlhps_avx(auVar82._0_16_,auVar95._0_16_);
        if ((SVar101.values.values[0] == 0.0) && (!NAN(SVar101.values.values[0]))) {
          uVar46 = 0xffffffffffffffff;
          do {
            if (uVar46 == 2) goto LAB_00447440;
            pfVar5 = afStack_2f0 + uVar46;
            uVar46 = uVar46 + 1;
          } while ((*pfVar5 == 0.0) && (!NAN(*pfVar5)));
          if (2 < uVar46) goto LAB_00447440;
        }
        if (((undefined1)local_2a8.flags & Specular) == Unset) {
          if (local_58._0_1_ == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          local_278._16_8_ =
               (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          local_278._0_8_ =
               (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          local_278._8_8_ =
               (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          TStack_260.z = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
          TStack_260.x = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).x;
          TStack_260.y = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).y;
          local_254.z = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          local_254.x = (paVar3->n).super_Tuple3<pbrt::Normal3,_float>.x;
          local_254.y = (paVar3->n).super_Tuple3<pbrt::Normal3,_float>.y;
          uVar46 = (local_218->
                   super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                   ).bits;
          pEVar48 = (ExhaustiveLightSampler *)(uVar46 & 0xffffffffffff);
          if (uVar46 < 0x3000000000000) {
            if ((uVar46 & 0x3000000000000) == 0x2000000000000) {
              local_368._0_8_ = local_98._8_8_;
              local_378._0_4_ =
                   PowerLightSampler::PDF
                             ((PowerLightSampler *)pEVar48,(LightSampleContext *)local_278,
                              (LightHandle *)local_368);
              local_378._4_4_ = extraout_XMM0_Db_01;
              uStack_370._0_4_ = (float)extraout_XMM0_Dc_01;
              uStack_370._4_4_ = (float)extraout_XMM0_Dd_01;
            }
            else {
              sVar14 = (pEVar48->lights).nStored;
              auVar52 = vcvtusi2ss_avx512f(auVar52,sVar14);
              fVar60 = 1.0 / auVar52._0_4_;
              auVar56._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar56._0_4_ = fVar60;
              auVar56._16_48_ = auVar57;
              auVar55._4_60_ = auVar56._4_60_;
              auVar55._0_4_ = (uint)(sVar14 != 0) * (int)fVar60;
              _local_378 = auVar55._0_16_;
            }
          }
          else if ((uVar46 & 0xfffe000000000000) == 0x2000000000000) {
            local_368._0_8_ = local_98._8_8_;
            local_378._0_4_ =
                 BVHLightSampler::PDF
                           ((BVHLightSampler *)pEVar48,(LightSampleContext *)local_278,
                            (LightHandle *)local_368);
            local_378._4_4_ = extraout_XMM0_Db_05;
            uStack_370._0_4_ = (float)extraout_XMM0_Dc_05;
            uStack_370._4_4_ = (float)extraout_XMM0_Dd_05;
          }
          else {
            local_368._0_8_ = local_98._8_8_;
            local_378._0_4_ =
                 ExhaustiveLightSampler::PDF
                           (pEVar48,(LightSampleContext *)local_278,(LightHandle *)local_368);
            local_378._4_4_ = extraout_XMM0_Db_06;
            uStack_370._0_4_ = (float)extraout_XMM0_Dc_06;
            uStack_370._4_4_ = (float)extraout_XMM0_Dd_06;
          }
          IStack_358 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          local_368._0_8_ =
               (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          unique0x10001bbb =
               (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          local_208 = CONCAT44(local_318.super_Tuple3<pbrt::Vector3,_float>.y,
                               local_318.super_Tuple3<pbrt::Vector3,_float>.x);
          fStack_348 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
          uStack_350._0_4_ = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).x;
          uStack_350._4_4_ = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).y;
          local_33c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          uVar11 = (paVar3->n).super_Tuple3<pbrt::Normal3,_float>.x;
          uVar18 = (paVar3->n).super_Tuple3<pbrt::Normal3,_float>.y;
          puStack_2b8 = &local_208;
          local_200 = local_318.super_Tuple3<pbrt::Vector3,_float>.z;
          local_2b0 = (ulong *)&local_2c4;
          local_2c4 = 0;
          uVar43 = (uint)(ushort)((ulong)local_98._8_8_ >> 0x30);
          uStack_344 = uVar11;
          uStack_340 = uVar18;
          local_2c0 = (Vector3f *)local_368;
          local_248 = (Interval<float>)local_368._0_8_;
          IStack_240 = unique0x10001bbb;
          IStack_238 = IStack_358;
          uStack_230 = uStack_350;
          local_228 = fStack_348;
          local_224 = uVar11;
          uStack_220 = uVar18;
          local_21c = local_33c;
          if ((ulong)local_98._8_8_ < 0x5000000000000) {
            fVar60 = 0.0;
            if (0x2ffffffffffff < (ulong)local_98._8_8_) {
              if ((uVar43 & 6) == 2) {
                LVar27.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar11;
                LVar27.n.super_Tuple3<pbrt::Normal3,_float>.z = fStack_348;
                LVar27.ns.super_Tuple3<pbrt::Normal3,_float>.z = local_33c;
                LVar27.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar18;
                LVar27.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)uStack_350;
                LVar27.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)uStack_350._4_4_;
                LVar27.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_> =
                     (Point3<pbrt::Interval<float>_>)
                     (Point3<pbrt::Interval<float>_>)
                     (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>;
                VVar104.super_Tuple3<pbrt::Vector3,_float>.z =
                     local_318.super_Tuple3<pbrt::Vector3,_float>.z;
                VVar104.super_Tuple3<pbrt::Vector3,_float>.x =
                     local_318.super_Tuple3<pbrt::Vector3,_float>.x;
                VVar104.super_Tuple3<pbrt::Vector3,_float>.y =
                     local_318.super_Tuple3<pbrt::Vector3,_float>.y;
                fVar60 = ProjectionLight::PDF_Li
                                   ((ProjectionLight *)(local_98._8_8_ & 0xffffffffffff),LVar27,
                                    VVar104,WithMIS);
              }
              else {
                LVar28.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar11;
                LVar28.n.super_Tuple3<pbrt::Normal3,_float>.z = fStack_348;
                LVar28.ns.super_Tuple3<pbrt::Normal3,_float>.z = local_33c;
                LVar28.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar18;
                LVar28.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)uStack_350;
                LVar28.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)uStack_350._4_4_;
                LVar28.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_> =
                     (Point3<pbrt::Interval<float>_>)
                     (Point3<pbrt::Interval<float>_>)
                     (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>;
                VVar105.super_Tuple3<pbrt::Vector3,_float>.z =
                     local_318.super_Tuple3<pbrt::Vector3,_float>.z;
                VVar105.super_Tuple3<pbrt::Vector3,_float>.x =
                     local_318.super_Tuple3<pbrt::Vector3,_float>.x;
                VVar105.super_Tuple3<pbrt::Vector3,_float>.y =
                     local_318.super_Tuple3<pbrt::Vector3,_float>.y;
                fVar60 = GoniometricLight::PDF_Li
                                   ((GoniometricLight *)(local_98._8_8_ & 0xffffffffffff),LVar28,
                                    VVar105,WithMIS);
              }
            }
          }
          else {
            local_210 = local_98._8_8_;
            fVar60 = detail::DispatchSplit<5>::operator()(&local_379,&local_210,uVar43 - 4);
          }
          if (*(ushort *)
               ((long)&(pBVar47->bxdf).
                       super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                       .bits + 6) - 3 < 2) {
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
                 local_318.super_Tuple3<pbrt::Vector3,_float>.y;
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x =
                 local_318.super_Tuple3<pbrt::Vector3,_float>.x;
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z =
                 local_318.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar88._0_4_ =
                 BSDF::PDF(pBVar47,(Vector3f)
                                   (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>,
                           wiRender_00,Radiance,All);
            auVar88._4_60_ = extraout_var_02;
            auVar52 = auVar88._0_16_;
          }
          else {
            auVar52 = ZEXT416((uint)local_2a8.pdf);
          }
          auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * (float)local_378._0_4_ *
                                                  fVar60 * (float)local_378._0_4_)),auVar52,auVar52)
          ;
          fVar60 = (auVar52._0_4_ * auVar52._0_4_) / auVar51._0_4_;
          auVar64._0_4_ = fVar60 * (float)local_308 * (float)local_2f8;
          auVar64._4_4_ = fVar60 * local_308._4_4_ * (float)auStack_2f4;
          auVar64._8_4_ = fVar60 * fStack_300 * afStack_2f0[0];
          auVar64._12_4_ = fVar60 * fStack_2fc * afStack_2f0[1];
        }
        else {
          auVar64._0_4_ = (float)local_308 * (float)local_2f8;
          auVar64._4_4_ = local_308._4_4_ * (float)auStack_2f4;
          auVar64._8_4_ = fStack_300 * afStack_2f0[0];
          auVar64._12_4_ = fStack_2fc * afStack_2f0[1];
        }
        auVar20._4_4_ = local_2a8.pdf;
        auVar20._0_4_ = local_2a8.pdf;
        auVar20._8_4_ = local_2a8.pdf;
        auVar20._12_4_ = local_2a8.pdf;
        auVar52 = vdivps_avx512vl(auVar64,auVar20);
        local_398._4_4_ = auVar52._4_4_ + (float)local_398._4_4_;
        local_398._0_4_ = auVar52._0_4_ + (float)local_398._0_4_;
        fStack_390 = auVar52._8_4_ + fStack_390;
        fStack_38c = auVar52._12_4_ + fStack_38c;
        goto LAB_00447440;
      }
    }
    local_98 = auVar72;
    pLVar13 = (((Integrator *)this_00)->infiniteLights).
              super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pLVar50 = (((Integrator *)this_00)->infiniteLights).
                   super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
                   .super__Vector_impl_data._M_start; pLVar50 != pLVar13; pLVar50 = pLVar50 + 1) {
      auVar57 = auVar83._16_48_;
      uVar46 = (pLVar50->
               super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
               ).bits;
      auVar52 = ZEXT816(0) << 0x40;
      auVar51 = ZEXT816(0) << 0x40;
      uVar43 = (uint)(ushort)(uVar46 >> 0x30);
      if (6 < uVar43) {
        uVar43 = uVar43 - 6;
        auVar52 = in_ZMM5._0_16_;
        if (uVar43 < 2) {
          auVar89 = ZEXT856(0);
          auVar99 = ZEXT856(0);
          in_ZMM5 = ZEXT1664(auVar52);
          SVar101 = UniformInfiniteLight::Le
                              ((UniformInfiniteLight *)(uVar46 & 0xffffffffffff),(Ray *)&local_1c8,
                               local_328);
          auVar96._0_8_ = SVar101.values.values._8_8_;
          auVar96._8_56_ = auVar99;
          auVar51 = auVar96._0_16_;
          auVar84._0_8_ = SVar101.values.values._0_8_;
          auVar84._8_56_ = auVar89;
          auVar52 = auVar84._0_16_;
        }
        else if (uVar43 == 2) {
          auVar89 = ZEXT856(0);
          auVar99 = ZEXT856(0);
          in_ZMM5 = ZEXT1664(auVar52);
          SVar101 = ImageInfiniteLight::Le
                              ((ImageInfiniteLight *)(uVar46 & 0xffffffffffff),(Ray *)&local_1c8,
                               local_328);
          auVar97._0_8_ = SVar101.values.values._8_8_;
          auVar97._8_56_ = auVar99;
          auVar51 = auVar97._0_16_;
          auVar85._0_8_ = SVar101.values.values._0_8_;
          auVar85._8_56_ = auVar89;
          auVar52 = auVar85._0_16_;
        }
        else {
          auVar89 = ZEXT856(0);
          auVar99 = ZEXT856(0);
          in_ZMM5 = ZEXT1664(auVar52);
          SVar101 = PortalImageInfiniteLight::Le
                              ((PortalImageInfiniteLight *)(uVar46 & 0xffffffffffff),
                               (Ray *)&local_1c8,local_328);
          auVar98._0_8_ = SVar101.values.values._8_8_;
          auVar98._8_56_ = auVar99;
          auVar51 = auVar98._0_16_;
          auVar86._0_8_ = SVar101.values.values._0_8_;
          auVar86._8_56_ = auVar89;
          auVar52 = auVar86._0_16_;
        }
      }
      auVar52 = vmovlhps_avx(auVar52,auVar51);
      if (((undefined1)local_2a8.flags & Specular) == Unset) {
        local_278._16_8_ =
             (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
        local_278._0_8_ =
             (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
        local_278._8_8_ =
             (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
        TStack_260.z = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
        TStack_260._0_8_ = *(undefined8 *)&pNVar1->super_Tuple3<pbrt::Normal3,_float>;
        local_254.z = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
        local_254.x = (paVar3->n).super_Tuple3<pbrt::Normal3,_float>.x;
        local_254.y = (paVar3->n).super_Tuple3<pbrt::Normal3,_float>.y;
        uVar46 = (local_218->
                 super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                 ).bits;
        local_368._0_8_ =
             (pLVar50->
             super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             ).bits;
        pEVar48 = (ExhaustiveLightSampler *)(uVar46 & 0xffffffffffff);
        auVar51 = in_ZMM5._0_16_;
        _local_378 = auVar52;
        if (uVar46 < 0x3000000000000) {
          if ((uVar46 & 0x3000000000000) == 0x2000000000000) {
            in_ZMM5 = ZEXT1664(auVar51);
            local_338._0_4_ =
                 PowerLightSampler::PDF
                           ((PowerLightSampler *)pEVar48,(LightSampleContext *)local_278,
                            (LightHandle *)local_368);
            local_338._4_4_ = extraout_XMM0_Db_02;
            local_338._8_4_ = extraout_XMM0_Dc_02;
            local_338._12_4_ = extraout_XMM0_Dd_02;
          }
          else {
            sVar14 = (pEVar48->lights).nStored;
            auVar52 = vcvtusi2ss_avx512f(auVar51,sVar14);
            fVar60 = 1.0 / auVar52._0_4_;
            auVar54._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar54._0_4_ = fVar60;
            auVar54._16_48_ = auVar57;
            auVar53._4_60_ = auVar54._4_60_;
            auVar53._0_4_ = (uint)(sVar14 != 0) * (int)fVar60;
            local_338 = auVar53._0_16_;
          }
        }
        else if ((uVar46 & 0xfffe000000000000) == 0x2000000000000) {
          in_ZMM5 = ZEXT1664(auVar51);
          local_338._0_4_ =
               BVHLightSampler::PDF
                         ((BVHLightSampler *)pEVar48,(LightSampleContext *)local_278,
                          (LightHandle *)local_368);
          local_338._4_4_ = extraout_XMM0_Db_03;
          local_338._8_4_ = extraout_XMM0_Dc_03;
          local_338._12_4_ = extraout_XMM0_Dd_03;
        }
        else {
          in_ZMM5 = ZEXT1664(auVar51);
          local_338._0_4_ =
               ExhaustiveLightSampler::PDF
                         (pEVar48,(LightSampleContext *)local_278,(LightHandle *)local_368);
          local_338._4_4_ = extraout_XMM0_Db_04;
          local_338._8_4_ = extraout_XMM0_Dc_04;
          local_338._12_4_ = extraout_XMM0_Dd_04;
        }
        IStack_358 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
        local_368._0_8_ =
             (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
        unique0x10001b5b =
             (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
        fStack_1d8 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
        uStack_1e0._0_4_ = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).x;
        uStack_1e0._4_4_ = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).y;
        local_33c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
        uVar10 = (paVar3->n).super_Tuple3<pbrt::Normal3,_float>.x;
        uVar17 = (paVar3->n).super_Tuple3<pbrt::Normal3,_float>.y;
        afStack_2f0[0] = local_318.super_Tuple3<pbrt::Vector3,_float>.z;
        _local_2f8 = CONCAT44(local_318.super_Tuple3<pbrt::Vector3,_float>.y,
                              local_318.super_Tuple3<pbrt::Vector3,_float>.x);
        local_210 = local_210 & 0xffffffff00000000;
        local_2c0 = (Vector3f *)local_368;
        puStack_2b8 = (ulong *)local_2f8;
        uStack_340 = uVar17;
        local_2b0 = &local_210;
        uStack_350 = SUB128(pNVar1->super_Tuple3<pbrt::Normal3,_float>,0);
        fStack_348 = (pNVar1->super_Tuple3<pbrt::Normal3,_float>).z;
        uStack_344 = uVar10;
        uVar46 = (pLVar50->
                 super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                 ).bits;
        uVar43 = (uint)(ushort)(uVar46 >> 0x30);
        auVar52 = in_ZMM5._0_16_;
        local_1f8 = (Interval<float>)local_368._0_8_;
        IStack_1f0 = unique0x10001b5b;
        IStack_1e8 = IStack_358;
        uStack_1d4 = uVar10;
        uStack_1d0 = uVar17;
        fStack_1cc = local_33c;
        if (uVar46 < 0x5000000000000) {
          fVar60 = 0.0;
          if (0x2ffffffffffff < uVar46) {
            if ((uVar43 & 6) == 2) {
              auVar31._8_8_ = uStack_1e0;
              auVar31._0_4_ = IStack_358.low;
              auVar31._4_4_ = IStack_358.high;
              auVar31._16_4_ = fStack_1d8;
              auVar31._20_4_ = uVar10;
              auVar30._24_4_ = uVar17;
              auVar30._0_24_ = auVar31;
              auVar30._28_4_ = local_33c;
              in_ZMM5 = ZEXT1664(auVar52);
              LVar25.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)uStack_1e0;
              LVar25.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)uStack_1e0._4_4_;
              LVar25.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_> =
                   (Point3<pbrt::Interval<float>_>)
                   (Point3<pbrt::Interval<float>_>)
                   (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>;
              LVar25.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)auVar31._16_8_;
              LVar25.ns.super_Tuple3<pbrt::Normal3,_float>.x =
                   (float)(int)((ulong)auVar31._16_8_ >> 0x20);
              LVar25.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)auVar30._24_8_;
              LVar25.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                   (float)(int)((ulong)auVar30._24_8_ >> 0x20);
              VVar102.super_Tuple3<pbrt::Vector3,_float>.z =
                   local_318.super_Tuple3<pbrt::Vector3,_float>.z;
              VVar102.super_Tuple3<pbrt::Vector3,_float>.x =
                   local_318.super_Tuple3<pbrt::Vector3,_float>.x;
              VVar102.super_Tuple3<pbrt::Vector3,_float>.y =
                   local_318.super_Tuple3<pbrt::Vector3,_float>.y;
              fVar60 = ProjectionLight::PDF_Li
                                 ((ProjectionLight *)(uVar46 & 0xffffffffffff),LVar25,VVar102,
                                  WithMIS);
            }
            else {
              auVar33._8_8_ = uStack_1e0;
              auVar33._0_4_ = IStack_358.low;
              auVar33._4_4_ = IStack_358.high;
              auVar33._16_4_ = fStack_1d8;
              auVar33._20_4_ = uVar10;
              auVar32._24_4_ = uVar17;
              auVar32._0_24_ = auVar33;
              auVar32._28_4_ = local_33c;
              in_ZMM5 = ZEXT1664(auVar52);
              LVar26.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)uStack_1e0;
              LVar26.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)uStack_1e0._4_4_;
              LVar26.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_> =
                   (Point3<pbrt::Interval<float>_>)
                   (Point3<pbrt::Interval<float>_>)
                   (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>;
              LVar26.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)auVar33._16_8_;
              LVar26.ns.super_Tuple3<pbrt::Normal3,_float>.x =
                   (float)(int)((ulong)auVar33._16_8_ >> 0x20);
              LVar26.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)auVar32._24_8_;
              LVar26.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                   (float)(int)((ulong)auVar32._24_8_ >> 0x20);
              VVar103.super_Tuple3<pbrt::Vector3,_float>.z =
                   local_318.super_Tuple3<pbrt::Vector3,_float>.z;
              VVar103.super_Tuple3<pbrt::Vector3,_float>.x =
                   local_318.super_Tuple3<pbrt::Vector3,_float>.x;
              VVar103.super_Tuple3<pbrt::Vector3,_float>.y =
                   local_318.super_Tuple3<pbrt::Vector3,_float>.y;
              fVar60 = GoniometricLight::PDF_Li
                                 ((GoniometricLight *)(uVar46 & 0xffffffffffff),LVar26,VVar103,
                                  WithMIS);
            }
          }
        }
        else {
          in_ZMM5 = ZEXT1664(auVar52);
          local_208 = uVar46;
          fVar60 = detail::DispatchSplit<5>::operator()
                             ((DispatchSplit<5> *)&local_2c4,&local_208,uVar43 - 4);
        }
        if (*(ushort *)
             ((long)&(local_320->bxdf).
                     super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                     .bits + 6) - 3 < 2) {
          wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
               local_318.super_Tuple3<pbrt::Vector3,_float>.y;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.x =
               local_318.super_Tuple3<pbrt::Vector3,_float>.x;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.z =
               local_318.super_Tuple3<pbrt::Vector3,_float>.z;
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          auVar87._0_4_ =
               BSDF::PDF(local_320,
                         (Vector3f)(intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>,
                         wiRender,Radiance,All);
          auVar87._4_60_ = extraout_var_01;
          auVar52 = auVar87._0_16_;
        }
        else {
          auVar52 = ZEXT416((uint)local_2a8.pdf);
        }
        auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * (float)local_338._0_4_ *
                                                fVar60 * (float)local_338._0_4_)),auVar52,auVar52);
        fVar60 = (auVar52._0_4_ * auVar52._0_4_) / auVar51._0_4_;
        auVar63._0_4_ = fVar60 * (float)local_378._0_4_ * (float)local_308;
        auVar63._4_4_ = fVar60 * (float)local_378._4_4_ * local_308._4_4_;
        auVar63._8_4_ = fVar60 * (float)uStack_370 * fStack_300;
        auVar63._12_4_ = fVar60 * uStack_370._4_4_ * fStack_2fc;
      }
      else {
        auVar63._0_4_ = auVar52._0_4_ * (float)local_308;
        auVar63._4_4_ = auVar52._4_4_ * local_308._4_4_;
        auVar63._8_4_ = auVar52._8_4_ * fStack_300;
        auVar63._12_4_ = auVar52._12_4_ * fStack_2fc;
      }
      auVar21._4_4_ = local_2a8.pdf;
      auVar21._0_4_ = local_2a8.pdf;
      auVar21._8_4_ = local_2a8.pdf;
      auVar21._12_4_ = local_2a8.pdf;
      auVar83._0_16_ = vdivps_avx512vl(auVar63,auVar21);
      auVar83._16_48_ = auVar57;
      local_398._4_4_ = auVar83._4_4_ + (float)local_398._4_4_;
      local_398._0_4_ = auVar83._0_4_ + (float)local_398._0_4_;
      fStack_390 = auVar83._8_4_ + fStack_390;
      fStack_38c = auVar83._12_4_ + fStack_38c;
    }
  }
LAB_00447440:
  auVar52 = vshufpd_avx(_local_398,_local_398,1);
  SVar101.values.values._0_8_ = local_398;
  SVar101.values.values._8_8_ = auVar52._0_8_;
  return (SampledSpectrum)SVar101.values.values;
}

Assistant:

SampledSpectrum SPPMIntegrator::SampleLd(const SurfaceInteraction &intr, const BSDF &bsdf,
                                         SampledWavelengths &lambda,
                                         SamplerHandle sampler,
                                         LightSamplerHandle lightSampler) const {
    // NOTE: share fragments from PathIntegrator::SampleLd here...
    pstd::optional<SampledLight> sampledLight =
        lightSampler.Sample(intr, sampler.Get1D());

    Point2f uLight = sampler.Get2D();

    SampledSpectrum Ld(0.f);

    if (sampledLight) {
        LightHandle light = sampledLight->light;
        DCHECK(light != nullptr && sampledLight->pdf > 0);

        // Sample light source with multiple importance sampling
        LightLiSample ls =
            light.SampleLi(intr, uLight, lambda, LightSamplingMode::WithMIS);
        if (ls && ls.L) {
            // Evaluate BSDF for light sampling strategy
            Vector3f wo = intr.wo, wi = ls.wi;
            SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, intr.shading.n);
            if (f) {
                SampledSpectrum Li = ls.L;
                if (Unoccluded(intr, ls.pLight)) {
                    // Add light's contribution to reflected radiance
                    Float lightPDF = sampledLight->pdf * ls.pdf;
                    if (IsDeltaLight(light.Type()))
                        Ld = f * Li / lightPDF;
                    else {
                        Float bsdfPDF = bsdf.PDF(wo, wi);
                        CHECK_RARE(1e-6, bsdf.SampledPDFIsProportional() == false &&
                                             bsdfPDF == 0);
                        Float weight = PowerHeuristic(1, lightPDF, 1, bsdfPDF);
                        Ld = f * Li * weight / lightPDF;
                    }
                }
            }
        }
    }

    Float uScattering = sampler.Get1D();
    BSDFSample bs = bsdf.Sample_f(intr.wo, uScattering, sampler.Get2D());
    if (!bs || !bs.f)
        return Ld;

    Vector3f wi = bs.wi;
    SampledSpectrum f = bs.f * AbsDot(wi, intr.shading.n);

    Ray ray = intr.SpawnRay(wi);
    pstd::optional<ShapeIntersection> si = Intersect(ray);
    if (si) {
        SampledSpectrum Le = si->intr.Le(-ray.d, lambda);
        if (Le) {
            if (bs.IsSpecular())
                Ld += f * Le / bs.pdf;
            else {
                // Compute MIS pdf...
                LightHandle areaLight(si->intr.areaLight);
                Float lightPDF = lightSampler.PDF(intr, areaLight) *
                                 areaLight.PDF_Li(intr, wi, LightSamplingMode::WithMIS);
                Float bsdfPDF =
                    bsdf.SampledPDFIsProportional() ? bsdf.PDF(intr.wo, wi) : bs.pdf;
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);
                Ld += f * Le * weight / bs.pdf;
            }
        }
    } else {
        for (const auto &light : infiniteLights) {
            SampledSpectrum Le = light.Le(ray, lambda);
            if (bs.IsSpecular())
                Ld += f * Le / bs.pdf;
            else {
                // Compute MIS pdf...
                Float lightPDF = lightSampler.PDF(intr, light) *
                                 light.PDF_Li(intr, wi, LightSamplingMode::WithMIS);
                Float bsdfPDF =
                    bsdf.SampledPDFIsProportional() ? bsdf.PDF(intr.wo, wi) : bs.pdf;
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);
                Ld += f * Le * weight / bs.pdf;
            }
        }
    }
    return Ld;
}